

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labeling_wychang_2015.h
# Opt level: O1

void __thiscall CCIT<TTA>::FirstScan(CCIT<TTA> *this)

{
  ulong uVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  char cVar5;
  int iVar6;
  uint uVar7;
  Mat1i *pMVar8;
  Mat1b *pMVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  bool bVar13;
  uint *puVar14;
  uint *puVar15;
  uint *puVar16;
  uint *puVar17;
  uint *puVar18;
  uint uVar19;
  int iVar20;
  int iVar21;
  ulong uVar22;
  long lVar23;
  long lVar24;
  long lVar25;
  uint uVar26;
  ulong uVar27;
  long lVar28;
  long lVar29;
  long lVar30;
  long lVar31;
  int iVar32;
  int iVar33;
  ulong uVar34;
  ulong uVar35;
  long lVar36;
  uint *puVar37;
  long lVar38;
  char *pcVar39;
  long lVar40;
  uint unaff_R12D;
  long lVar41;
  long lVar42;
  uint *img_labels_row_prev_prev;
  uchar *img_row_fol;
  uchar *img_row;
  ulong local_88;
  long local_80;
  long local_78;
  long local_70;
  
  pMVar8 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_;
  iVar33 = 0;
  memset(*(void **)&pMVar8->field_0x10,0,*(long *)&pMVar8->field_0x20 - *(long *)&pMVar8->field_0x18
        );
  puVar14 = TTA::rtable_;
  *TTA::rtable_ = 0;
  puVar17 = TTA::tail_;
  puVar15 = TTA::next_;
  TTA::length_ = 1;
  pMVar8 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_;
  iVar6 = *(int *)&pMVar8->field_0xc;
  lVar42 = (long)iVar6;
  uVar7 = *(uint *)&pMVar8->field_0x8;
  uVar27 = (ulong)uVar7;
  if (0 < lVar42) {
    pMVar9 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
    lVar10 = *(long *)&pMVar9->field_0x10;
    lVar11 = **(long **)&pMVar9->field_0x48;
    lVar2 = lVar10 + lVar11;
    lVar12 = *(long *)&pMVar8->field_0x10;
    do {
      lVar36 = (long)iVar33;
      if (*(char *)(lVar10 + lVar36) == '\0') {
        lVar28 = lVar36 + 1;
        iVar32 = (int)lVar28;
        if ((iVar32 < iVar6) && (*(char *)(lVar10 + lVar28) != '\0')) {
LAB_001d6f16:
          puVar14[TTA::length_] = TTA::length_;
          puVar15[TTA::length_] = 0xffffffff;
          puVar17[TTA::length_] = TTA::length_;
          unaff_R12D = TTA::length_;
          uVar19 = TTA::length_ + 1;
          *(uint *)(lVar12 + lVar36 * 4) = TTA::length_;
          TTA::length_ = uVar19;
          bVar13 = true;
          goto LAB_001d6f5e;
        }
        if (((int)uVar7 < 2) || (*(char *)(lVar2 + lVar36) == '\0')) {
          bVar13 = false;
          if (((int)uVar7 < 2) || (iVar6 <= iVar32)) goto LAB_001d6f5e;
          if (*(char *)(lVar2 + lVar28) != '\0') goto LAB_001d6f16;
        }
        else {
          puVar14[TTA::length_] = TTA::length_;
          puVar15[TTA::length_] = 0xffffffff;
          puVar17[TTA::length_] = TTA::length_;
          unaff_R12D = TTA::length_;
          uVar19 = TTA::length_ + 1;
          *(uint *)(lVar12 + lVar36 * 4) = TTA::length_;
          TTA::length_ = uVar19;
          if (iVar32 < iVar6) {
            cVar5 = *(char *)(lVar2 + lVar28);
            goto joined_r0x001d6efc;
          }
        }
LAB_001d6f5b:
        bVar13 = false;
      }
      else {
        puVar14[TTA::length_] = TTA::length_;
        puVar15[TTA::length_] = 0xffffffff;
        puVar17[TTA::length_] = TTA::length_;
        unaff_R12D = TTA::length_;
        uVar19 = TTA::length_ + 1;
        *(uint *)(lVar12 + lVar36 * 4) = TTA::length_;
        TTA::length_ = uVar19;
        lVar36 = lVar36 + 1;
        if (iVar6 <= (int)lVar36) goto LAB_001d6f5b;
        bVar13 = true;
        if (*(char *)(lVar10 + lVar36) == '\0') {
          if (1 < (int)uVar7) {
            cVar5 = *(char *)(lVar2 + lVar36);
joined_r0x001d6efc:
            bVar13 = true;
            if (cVar5 != '\0') goto LAB_001d6f5e;
          }
          goto LAB_001d6f5b;
        }
      }
LAB_001d6f5e:
      puVar18 = TTA::tail_;
      puVar16 = TTA::next_;
      iVar32 = iVar33 + 2;
      if ((bVar13) && (iVar32 < iVar6)) {
        lVar36 = (long)iVar32;
        pcVar39 = (char *)(lVar10 + lVar36);
        puVar37 = (uint *)(lVar12 + lVar36 * 4);
        iVar33 = iVar33 + 3;
        do {
          iVar32 = iVar33;
          lVar36 = lVar36 + 2;
          if (*pcVar39 == '\0') {
            if ((iVar32 < iVar6) && (*(char *)(lVar10 + iVar32) != '\0')) {
              if (((int)uVar7 < 2) || (pcVar39[lVar11] == '\0')) {
LAB_001d702a:
                puVar14[TTA::length_] = TTA::length_;
                puVar16[TTA::length_] = 0xffffffff;
                puVar18[TTA::length_] = TTA::length_;
                unaff_R12D = TTA::length_;
                uVar19 = TTA::length_ + 1;
                *puVar37 = TTA::length_;
                TTA::length_ = uVar19;
              }
              else {
                *puVar37 = unaff_R12D;
              }
              bVar13 = true;
              goto LAB_001d705e;
            }
            if (((int)uVar7 < 2) || (pcVar39[lVar11] == '\0')) {
              bVar13 = false;
              if (((int)uVar7 < 2) || (iVar6 <= iVar32)) goto LAB_001d705e;
              if (*(char *)(lVar2 + iVar32) != '\0') goto LAB_001d702a;
            }
            else {
              *puVar37 = unaff_R12D;
              if (iVar32 < iVar6) goto LAB_001d700a;
            }
LAB_001d705c:
            bVar13 = false;
          }
          else {
            *puVar37 = unaff_R12D;
            if (iVar6 <= iVar32) goto LAB_001d705c;
            bVar13 = true;
            if (*(char *)(lVar10 + iVar32) == '\0') {
              if (1 < (int)uVar7) {
LAB_001d700a:
                bVar13 = true;
                if (*(char *)(lVar2 + iVar32) != '\0') goto LAB_001d705e;
              }
              goto LAB_001d705c;
            }
          }
LAB_001d705e:
          if (!bVar13) break;
          pcVar39 = pcVar39 + 2;
          puVar37 = puVar37 + 2;
          iVar33 = iVar32 + 2;
        } while (lVar36 < lVar42);
        iVar32 = iVar32 + 1;
      }
      iVar33 = iVar32;
    } while (iVar33 < iVar6);
  }
  if (2 < (int)uVar7) {
    local_88 = 2;
    local_70 = 1;
    local_78 = 3;
    local_80 = 0;
    do {
      if (0 < iVar6) {
        pMVar9 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
        pMVar8 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_;
        lVar2 = *(long *)&pMVar9->field_0x10;
        lVar10 = **(long **)&pMVar9->field_0x48;
        lVar36 = lVar10 * local_88 + lVar2;
        lVar38 = lVar36 - lVar10;
        lVar28 = lVar36 + lVar10;
        lVar11 = *(long *)&pMVar8->field_0x10;
        lVar12 = **(long **)&pMVar8->field_0x48;
        lVar41 = lVar12 * local_88 + lVar11;
        lVar40 = lVar41 + lVar12 * -2;
        uVar35 = local_88 | 1;
        uVar34 = 0;
        do {
          iVar33 = (int)uVar34;
          uVar22 = (ulong)iVar33;
          uVar1 = uVar22 + 1;
          iVar32 = (int)uVar1;
          uVar19 = TTA::length_;
          if (*(char *)(lVar36 + uVar22) == '\0') {
            if ((iVar6 <= iVar32) || (*(char *)(lVar36 + uVar1) == '\0')) {
              if ((uVar35 < uVar27) && (*(char *)(lVar28 + uVar22) != '\0')) {
                TTA::rtable_[TTA::length_] = TTA::length_;
                TTA::next_[TTA::length_] = 0xffffffff;
                TTA::tail_[TTA::length_] = TTA::length_;
                unaff_R12D = TTA::length_;
                uVar19 = TTA::length_ + 1;
                *(uint *)(lVar41 + uVar22 * 4) = TTA::length_;
                TTA::length_ = uVar19;
                if (iVar6 <= iVar32) goto LAB_001d7351;
                goto LAB_001d733f;
              }
              bVar13 = false;
              if ((uVar27 <= uVar35) || (iVar6 <= iVar32)) goto LAB_001d7449;
              if (*(char *)(lVar28 + uVar1) != '\0') goto LAB_001d7404;
              goto LAB_001d7351;
            }
            if (*(char *)(lVar38 + uVar1) == '\0') {
              if (*(char *)(lVar38 + uVar22) != '\0') {
                unaff_R12D = *(uint *)(lVar40 + uVar22 * 4);
                *(uint *)(lVar41 + uVar22 * 4) = unaff_R12D;
                goto LAB_001d73c0;
              }
LAB_001d73ea:
              if (((int)(uVar22 + 2) < iVar6) && (*(char *)(lVar38 + uVar22 + 2) != '\0')) {
                unaff_R12D = *(uint *)(lVar40 + 8 + uVar22 * 4);
              }
              else {
LAB_001d7404:
                TTA::rtable_[TTA::length_] = TTA::length_;
                TTA::next_[TTA::length_] = 0xffffffff;
                TTA::tail_[TTA::length_] = TTA::length_;
                uVar19 = TTA::length_ + 1;
                unaff_R12D = TTA::length_;
              }
            }
            else {
              unaff_R12D = *(uint *)(lVar40 + uVar22 * 4);
            }
            TTA::length_ = uVar19;
            *(uint *)(lVar41 + uVar22 * 4) = unaff_R12D;
            bVar13 = true;
          }
          else if ((iVar32 < iVar6) && (*(char *)(lVar36 + uVar1) != '\0')) {
            if (*(char *)(lVar38 + uVar22) == '\0') {
              if (*(char *)(lVar38 + uVar1) == '\0') {
                if ((iVar33 < 2) || (*(char *)(lVar38 + -1 + uVar22) == '\0')) goto LAB_001d73ea;
                unaff_R12D = *(uint *)(lVar40 + -8 + uVar22 * 4);
                *(uint *)(lVar41 + uVar22 * 4) = unaff_R12D;
                uVar22 = uVar34;
                goto LAB_001d73c0;
              }
              unaff_R12D = *(uint *)(lVar40 + uVar22 * 4);
              *(uint *)(lVar41 + uVar22 * 4) = unaff_R12D;
              bVar13 = true;
              if ((iVar33 < 2) || (*(char *)(lVar38 + -1 + uVar22) == '\0')) goto LAB_001d7449;
              uVar19 = *(uint *)(lVar40 + -8 + uVar22 * 4);
            }
            else {
              unaff_R12D = *(uint *)(lVar40 + uVar22 * 4);
              *(uint *)(lVar41 + uVar22 * 4) = unaff_R12D;
              bVar13 = true;
              if (*(char *)(lVar38 + uVar1) != '\0') goto LAB_001d7449;
LAB_001d73c0:
              bVar13 = true;
              if ((iVar6 <= (int)(uVar22 + 2)) || (*(char *)(lVar38 + uVar22 + 2) == '\0'))
              goto LAB_001d7449;
              uVar19 = *(uint *)(lVar40 + 8 + uVar22 * 4);
            }
            bVar13 = true;
            TTA::Merge(unaff_R12D,uVar19);
          }
          else {
            if (*(char *)(lVar38 + uVar22) == '\0') {
              if ((iVar33 < 2) || (*(char *)(lVar38 + -1 + uVar22) == '\0')) {
                if ((iVar32 < iVar6) && (*(char *)(lVar38 + uVar1) != '\0')) goto LAB_001d71ce;
                TTA::rtable_[TTA::length_] = TTA::length_;
                TTA::next_[TTA::length_] = 0xffffffff;
                TTA::tail_[TTA::length_] = TTA::length_;
                unaff_R12D = TTA::length_;
                TTA::length_ = TTA::length_ + 1;
                goto LAB_001d732a;
              }
              unaff_R12D = *(uint *)(lVar40 + -8 + uVar22 * 4);
              *(uint *)(lVar41 + uVar22 * 4) = unaff_R12D;
              if ((iVar32 < iVar6) && (*(char *)(lVar38 + (uVar1 & 0xffffffff)) != '\0')) {
                TTA::Merge(unaff_R12D,*(uint *)(lVar40 + uVar22 * 4));
              }
            }
            else {
LAB_001d71ce:
              unaff_R12D = *(uint *)(lVar40 + uVar22 * 4);
LAB_001d732a:
              *(uint *)(lVar41 + uVar22 * 4) = unaff_R12D;
            }
            if ((iVar32 < iVar6) && (uVar35 < uVar27)) {
LAB_001d733f:
              bVar13 = true;
              if (*(char *)(lVar28 + uVar1) != '\0') goto LAB_001d7449;
            }
LAB_001d7351:
            bVar13 = false;
          }
LAB_001d7449:
          uVar19 = iVar33 + 2;
          if ((bVar13) && ((int)uVar19 < iVar6)) {
            lVar29 = (long)(int)uVar19;
            lVar3 = lVar41 + lVar29 * 4;
            lVar23 = lVar10 * local_70 + lVar2 + lVar29;
            lVar4 = lVar12 * local_80 + lVar11 + lVar29 * 4;
            lVar24 = lVar10 * local_78 + lVar2 + lVar29;
            lVar31 = 0;
            do {
              uVar1 = uVar34 + 3 + lVar31;
              iVar21 = (int)uVar1;
              iVar32 = (int)lVar31;
              if (*(char *)(lVar36 + lVar29 + lVar31) == '\0') {
                if ((iVar21 < iVar6) && (lVar25 = (long)iVar21, *(char *)(lVar36 + lVar25) != '\0'))
                {
                  if ((uVar27 <= uVar35) || (*(char *)(lVar24 + lVar31) == '\0')) {
                    uVar19 = TTA::length_;
                    if (*(char *)(lVar38 + lVar25) == '\0') {
                      if (*(char *)(lVar23 + lVar31) != '\0') {
                        unaff_R12D = *(uint *)(lVar4 + lVar31 * 4);
                        *(uint *)(lVar3 + lVar31 * 4) = unaff_R12D;
                        goto LAB_001d77d2;
                      }
                      iVar32 = iVar32 + iVar33 + 4;
                      if ((iVar6 <= iVar32) || (*(char *)(lVar38 + iVar32) == '\0'))
                      goto LAB_001d7635;
                      unaff_R12D = *(uint *)(lVar40 + (long)iVar32 * 4);
                    }
                    else {
                      unaff_R12D = *(uint *)(lVar4 + lVar31 * 4);
                    }
LAB_001d76ec:
                    TTA::length_ = uVar19;
                    *(uint *)(lVar3 + lVar31 * 4) = unaff_R12D;
                    goto LAB_001d773e;
                  }
                  *(uint *)(lVar3 + lVar31 * 4) = unaff_R12D;
                  if (*(char *)(lVar38 + lVar25) == '\0') {
                    if (*(char *)(lVar23 + lVar31) != '\0') {
                      iVar21 = iVar32 + iVar33 + 4;
                      if ((iVar21 < iVar6) && (*(char *)(lVar38 + iVar21) != '\0')) {
                        uVar19 = TTA::Merge(*(uint *)(lVar4 + lVar31 * 4),
                                            *(uint *)(lVar40 + (long)iVar21 * 4));
                      }
                      else {
                        uVar19 = *(uint *)(lVar4 + lVar31 * 4);
                      }
                      goto LAB_001d787f;
                    }
                  }
                  else {
                    uVar19 = *(uint *)(lVar4 + lVar31 * 4);
LAB_001d787f:
                    TTA::Merge(unaff_R12D,uVar19);
                  }
                  iVar32 = iVar32 + iVar33 + 4;
                  if ((iVar32 < iVar6) && (*(char *)(lVar38 + iVar32) != '\0')) {
                    uVar19 = *(uint *)(lVar40 + (long)iVar32 * 4);
                    goto LAB_001d78af;
                  }
LAB_001d78b9:
                  bVar13 = true;
                  goto LAB_001d7741;
                }
                if ((uVar27 <= uVar35) || (*(char *)(lVar24 + lVar31) == '\0')) {
                  bVar13 = false;
                  if ((uVar35 < uVar27) && (iVar21 < iVar6)) {
                    if (*(char *)(lVar28 + iVar21) != '\0') {
LAB_001d7635:
                      TTA::rtable_[TTA::length_] = TTA::length_;
                      TTA::next_[TTA::length_] = 0xffffffff;
                      TTA::tail_[TTA::length_] = TTA::length_;
                      uVar19 = TTA::length_ + 1;
                      unaff_R12D = TTA::length_;
                      goto LAB_001d76ec;
                    }
                    goto LAB_001d76d4;
                  }
                  goto LAB_001d7741;
                }
                *(uint *)(lVar3 + lVar31 * 4) = unaff_R12D;
                if (iVar21 < iVar6) goto LAB_001d7576;
LAB_001d76d4:
                bVar13 = false;
              }
              else {
                uVar22 = lVar31 + uVar34;
                *(uint *)(lVar3 + lVar31 * 4) = unaff_R12D;
                iVar20 = (int)uVar22;
                if ((iVar6 <= iVar21) || (*(char *)(lVar36 + iVar21) == '\0')) {
                  *(uint *)(lVar3 + lVar31 * 4) = unaff_R12D;
                  if (*(char *)(lVar23 + lVar31) == '\0') {
                    if ((-1 < iVar20) &&
                       (uVar22 = uVar22 & 0xffffffff, *(char *)(lVar38 + 1 + uVar22) != '\0')) {
                      if ((iVar21 < iVar6) && (*(char *)(lVar38 + (uVar1 & 0xffffffff)) != '\0')) {
                        uVar19 = TTA::Merge(*(uint *)(lVar40 + uVar22 * 4),
                                            *(uint *)(lVar4 + lVar31 * 4));
                      }
                      else {
                        uVar19 = *(uint *)(lVar40 + uVar22 * 4);
                      }
                      goto LAB_001d754d;
                    }
                    if (iVar6 <= iVar21) goto LAB_001d76d4;
                    if (*(char *)(lVar38 + iVar21) != '\0') goto LAB_001d7545;
                  }
                  else {
LAB_001d7545:
                    uVar19 = *(uint *)(lVar4 + lVar31 * 4);
LAB_001d754d:
                    TTA::Merge(unaff_R12D,uVar19);
                  }
                  if ((iVar21 < iVar6) && (uVar35 < uVar27)) {
LAB_001d7576:
                    bVar13 = true;
                    if (*(char *)(lVar28 + iVar21) != '\0') goto LAB_001d7741;
                  }
                  goto LAB_001d76d4;
                }
                cVar5 = *(char *)(lVar38 + iVar21);
                if (*(char *)(lVar23 + lVar31) == '\0') {
                  if (cVar5 != '\0') {
                    if ((iVar20 < 0) || (*(char *)(lVar38 + 1 + (uVar22 & 0xffffffff)) == '\0'))
                    goto LAB_001d7726;
                    uVar19 = *(uint *)(lVar40 + (uVar22 & 0xffffffff) * 4);
                    uVar26 = *(uint *)(lVar4 + lVar31 * 4);
                    goto LAB_001d771a;
                  }
                  if ((-1 < iVar20) &&
                     (uVar22 = uVar22 & 0xffffffff, *(char *)(lVar38 + 1 + uVar22) != '\0')) {
                    uVar26 = iVar32 + iVar33 + 4;
                    if (((int)uVar26 < iVar6) && (*(char *)(lVar38 + (ulong)uVar26) != '\0')) {
                      uVar19 = *(uint *)(lVar40 + uVar22 * 4);
                      uVar26 = *(uint *)(lVar40 + (ulong)uVar26 * 4);
                      goto LAB_001d771a;
                    }
                    uVar19 = *(uint *)(lVar40 + uVar22 * 4);
                    goto LAB_001d7731;
                  }
LAB_001d77d2:
                  iVar32 = iVar32 + iVar33 + 4;
                  bVar13 = true;
                  if ((iVar6 <= iVar32) || (*(char *)(lVar38 + iVar32) == '\0')) goto LAB_001d7741;
                  uVar19 = *(uint *)(lVar40 + (long)iVar32 * 4);
LAB_001d78af:
                  TTA::Merge(unaff_R12D,uVar19);
                  goto LAB_001d78b9;
                }
                if (((cVar5 == '\0') && (iVar32 = iVar32 + iVar33 + 4, iVar32 < iVar6)) &&
                   (*(char *)(lVar38 + iVar32) != '\0')) {
                  uVar19 = *(uint *)(lVar4 + lVar31 * 4);
                  uVar26 = *(uint *)(lVar40 + (long)iVar32 * 4);
LAB_001d771a:
                  uVar19 = TTA::Merge(uVar19,uVar26);
                }
                else {
LAB_001d7726:
                  uVar19 = *(uint *)(lVar4 + lVar31 * 4);
                }
LAB_001d7731:
                TTA::Merge(unaff_R12D,uVar19);
LAB_001d773e:
                bVar13 = true;
              }
LAB_001d7741:
              lVar25 = lVar31 + 2;
            } while ((bVar13) && (lVar30 = lVar29 + lVar31, lVar31 = lVar25, lVar30 + 2 < lVar42));
            uVar19 = (int)lVar25 + iVar33 + 2;
          }
          uVar34 = (ulong)uVar19;
        } while ((int)uVar19 < iVar6);
      }
      local_88 = local_88 + 2;
      local_70 = local_70 + 2;
      local_80 = local_80 + 2;
      local_78 = local_78 + 2;
    } while ((int)local_88 < (int)uVar7);
  }
  return;
}

Assistant:

void FirstScan()
    {
        memset(img_labels_.data, 0, img_labels_.dataend - img_labels_.datastart); // Initialization
        LabelsSolver::Setup();

        // First Scan
        int w = img_labels_.cols;
        int h = img_labels_.rows;

        int lx, u, v, k;

#define CONDITION_B1 img_row[x] > 0 
#define CONDITION_B2 x+1<w && img_row[x+1] > 0              // WRONG in the original code -> add missing condition 
#define CONDITION_B3 y+1<h && img_row_fol[x] > 0            // WRONG in the original code -> add missing condition
#define CONDITION_B4 x+1<w && y+1<h && img_row_fol[x+1] > 0 // WRONG in the original code -> add missing condition
#define CONDITION_U1 x-1>0 && img_row_prev[x-1] > 0         // WRONG in the original code -> add missing condition
#define CONDITION_U2 img_row_prev[x] > 0
#define CONDITION_U3 x+1<w && img_row_prev[x+1] > 0         // WRONG in the original code -> add missing condition
#define CONDITION_U4 x+2<w && img_row_prev[x+2] > 0         // WRONG in the original code -> add missing condition
#define ASSIGN_S img_labels_row[x] = img_labels_row[x-2]
#define ASSIGN_P img_labels_row[x] = img_labels_row_prev_prev[x-2]
#define ASSIGN_Q img_labels_row[x] = img_labels_row_prev_prev[x]
#define ASSIGN_R img_labels_row[x] = img_labels_row_prev_prev[x+2]
#define ASSIGN_LX img_labels_row[x] = lx
#define LOAD_LX u = lx
#define LOAD_PU u = img_labels_row_prev_prev[x-2]
#define LOAD_PV v = img_labels_row_prev_prev[x-2]
#define LOAD_QU u = img_labels_row_prev_prev[x]
#define LOAD_QV v = img_labels_row_prev_prev[x]
#define LOAD_QK k = img_labels_row_prev_prev[x]
#define LOAD_RV v = img_labels_row_prev_prev[x+2]
#define LOAD_RK k = img_labels_row_prev_prev[x+2]
#define NEW_LABEL lx = img_labels_row[x] = LabelsSolver::NewLabel();
#define RESOLVE_2(u, v) LabelsSolver::Merge(u,v);
#define RESOLVE_3(u, v, k) LabelsSolver::Merge(u,LabelsSolver::Merge(v,k));

        bool nextprocedure2;

        int y = 0; // Extract from the first for
        const unsigned char* const img_row = img_.ptr<unsigned char>(y);
        const unsigned char* const img_row_fol = (unsigned char *)(((char *)img_row) + img_.step.p[0]);
        unsigned int* const img_labels_row = img_labels_.ptr<unsigned int>(y);

        // Process first two rows
        for (int x = 0; x < w; x += 2) {

#include "labeling_wychang_2015_tree_0.inc.h"

        }

        for (int y = 2; y < h; y += 2) {
            const unsigned char* const img_row = img_.ptr<unsigned char>(y);
            const unsigned char* const img_row_prev = (unsigned char *)(((char *)img_row) - img_.step.p[0]);
            const unsigned char* const img_row_fol = (unsigned char *)(((char *)img_row) + img_.step.p[0]);
            unsigned int* const img_labels_row = img_labels_.ptr<unsigned int>(y);
            unsigned int* const img_labels_row_prev_prev = (unsigned int *)(((char *)img_labels_row) - img_labels_.step.p[0] - img_labels_.step.p[0]);
            for (int x = 0; x < w; x += 2) {

#include "labeling_wychang_2015_tree.inc.h"

            }
        }

#undef CONDITION_B1 
#undef CONDITION_B2 
#undef CONDITION_B3 
#undef CONDITION_B4 
#undef CONDITION_U1 
#undef CONDITION_U2 
#undef CONDITION_U3 
#undef CONDITION_U4 
#undef ASSIGN_S
#undef ASSIGN_P
#undef ASSIGN_Q
#undef ASSIGN_R
#undef ASSIGN_LX 
#undef LOAD_LX 
#undef LOAD_PU 
#undef LOAD_PV 
#undef LOAD_QU 
#undef LOAD_QV 
#undef LOAD_QK 
#undef LOAD_RV 
#undef LOAD_RK 
#undef NEW_LABEL
#undef RESOLVE_2
#undef RESOLVE_3
    }